

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlNewComment(xmlChar *content)

{
  xmlNodePtr pxVar1;
  xmlChar *pxVar2;
  xmlRegisterNodeFunc *pp_Var3;
  
  pxVar1 = (xmlNodePtr)(*xmlMalloc)(0x78);
  if (pxVar1 == (xmlNodePtr)0x0) {
    xmlTreeErrMemory("building comment");
  }
  else {
    pxVar1->_private = (void *)0x0;
    *(undefined8 *)&pxVar1->type = 0;
    pxVar1->name = (xmlChar *)0x0;
    pxVar1->children = (_xmlNode *)0x0;
    pxVar1->nsDef = (xmlNs *)0x0;
    pxVar1->psvi = (void *)0x0;
    pxVar1->content = (xmlChar *)0x0;
    pxVar1->properties = (_xmlAttr *)0x0;
    pxVar1->doc = (_xmlDoc *)0x0;
    pxVar1->ns = (xmlNs *)0x0;
    pxVar1->next = (_xmlNode *)0x0;
    pxVar1->prev = (_xmlNode *)0x0;
    pxVar1->last = (_xmlNode *)0x0;
    pxVar1->parent = (_xmlNode *)0x0;
    pxVar1->line = 0;
    pxVar1->extra = 0;
    *(undefined4 *)&pxVar1->field_0x74 = 0;
    pxVar1->type = XML_COMMENT_NODE;
    pxVar1->name = "comment";
    if (content != (xmlChar *)0x0) {
      pxVar2 = xmlStrdup(content);
      pxVar1->content = pxVar2;
    }
    if (__xmlRegisterCallbacks != 0) {
      pp_Var3 = __xmlRegisterNodeDefaultValue();
      if (*pp_Var3 != (xmlRegisterNodeFunc)0x0) {
        pp_Var3 = __xmlRegisterNodeDefaultValue();
        (**pp_Var3)(pxVar1);
      }
    }
  }
  return pxVar1;
}

Assistant:

xmlNodePtr
xmlNewComment(const xmlChar *content) {
    xmlNodePtr cur;

    /*
     * Allocate a new node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL) {
	xmlTreeErrMemory("building comment");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_COMMENT_NODE;

    cur->name = xmlStringComment;
    if (content != NULL) {
	cur->content = xmlStrdup(content);
    }

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(cur);
    return(cur);
}